

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O0

void __thiscall Control::convertUnits(Control *this,Network *network)

{
  Tank *this_00;
  double dVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  Tank *tank;
  Network *network_local;
  Control *this_local;
  
  if (*(int *)&(this->super_Element).field_0x2c == 0) {
    this_00 = (Tank *)this->node;
    dVar2 = this->head;
    dVar1 = Network::ucf(network,LENGTH);
    this->head = dVar2 / dVar1 + this->node->elev;
    dVar2 = Tank::findVolume(this_00,this->head);
    this->volume = dVar2;
  }
  else if (*(int *)&(this->super_Element).field_0x2c == 1) {
    dVar2 = this->head;
    dVar1 = Network::ucf(network,PRESSURE);
    this->head = dVar2 / dVar1 + this->node->elev;
  }
  if (this->link != (Link *)0x0) {
    (*(this->link->super_Element)._vptr_Element[5])(this->setting,this->link,network);
    this->setting = extraout_XMM0_Qa;
  }
  return;
}

Assistant:

void Control::convertUnits(Network* network)
{
    if ( type == TANK_LEVEL )
    {
        Tank* tank = static_cast<Tank*>(node);
        head = head / network->ucf(Units::LENGTH) + node->elev;
        volume = tank->findVolume(head);
    }

    else if ( type == PRESSURE_LEVEL )
    {
        head = head / network->ucf(Units::PRESSURE) + node->elev;
    }

    if ( link ) setting = link->convertSetting(network, setting);
}